

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

int __thiscall rengine::Node::remove(Node *this,char *__filename)

{
  char *pcVar1;
  Node *pNVar2;
  bool bVar3;
  
  if (__filename == (char *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,0x8c,"void rengine::Node::remove(Node *)");
  }
  pNVar2 = this->m_child;
  bVar3 = pNVar2 != (Node *)0x0;
  if (pNVar2 != (Node *)__filename && bVar3) {
    do {
      pNVar2 = sibling(pNVar2);
      bVar3 = pNVar2 != (Node *)0x0;
      if (pNVar2 == (Node *)0x0) break;
    } while (pNVar2 != (Node *)__filename);
  }
  if (bVar3) {
    pcVar1 = __filename + 0x20;
    pNVar2 = *(Node **)(__filename + 0x20);
    if (pNVar2 == (Node *)__filename) {
      this->m_child = (Node *)0x0;
    }
    else {
      if (this->m_child == (Node *)__filename) {
        this->m_child = pNVar2;
      }
      pNVar2->m_prev = *(Node **)(__filename + 0x28);
      *(Node **)(*(long *)(__filename + 0x28) + 0x20) = pNVar2;
    }
    __filename[0x10] = '\0';
    __filename[0x11] = '\0';
    __filename[0x12] = '\0';
    __filename[0x13] = '\0';
    __filename[0x14] = '\0';
    __filename[0x15] = '\0';
    __filename[0x16] = '\0';
    __filename[0x17] = '\0';
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    __filename[0x28] = '\0';
    __filename[0x29] = '\0';
    __filename[0x2a] = '\0';
    __filename[0x2b] = '\0';
    __filename[0x2c] = '\0';
    __filename[0x2d] = '\0';
    __filename[0x2e] = '\0';
    __filename[0x2f] = '\0';
    return (int)pcVar1;
  }
  __assert_fail("hasChild(child)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                ,0x8d,"void rengine::Node::remove(Node *)");
}

Assistant:

void remove(Node *child) {
        assert(child);
        assert(hasChild(child));

        // only child..
        if (child->m_next == child) {
            m_child = 0;
        } else {
            if (m_child == child)
                m_child = child->m_next;
            child->m_next->m_prev = child->m_prev;
            child->m_prev->m_next = child->m_next;
        }
        child->m_next = 0;
        child->m_prev = 0;
        child->setParent(0);
    }